

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleParamNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  int iVar1;
  Property *pPVar2;
  Value *this_00;
  char *pcVar3;
  float fVar4;
  float floatVal;
  Value *val;
  allocator<char> local_49;
  string local_48;
  Property *local_28;
  Property *prop;
  aiScene *param_2_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  if (node != (DDLNode *)0x0) {
    prop = (Property *)param_2;
    param_2_local = (aiScene *)node;
    node_local = (DDLNode *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"attrib",&local_49);
    pPVar2 = ODDLParser::DDLNode::findPropertyByName(node,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (((pPVar2 != (Property *)0x0) && (pPVar2->m_value != (Value *)0x0)) &&
       (local_28 = pPVar2, this_00 = ODDLParser::DDLNode::getValue((DDLNode *)param_2_local),
       this_00 != (Value *)0x0)) {
      fVar4 = ODDLParser::Value::getFloat(this_00);
      pcVar3 = ODDLParser::Value::getString(local_28->m_value);
      iVar1 = ASSIMP_strincmp("fov",pcVar3,3);
      if (iVar1 == 0) {
        this->m_currentCamera->mHorizontalFOV = fVar4;
      }
      else {
        pcVar3 = ODDLParser::Value::getString(local_28->m_value);
        iVar1 = ASSIMP_strincmp("near",pcVar3,4);
        if (iVar1 == 0) {
          this->m_currentCamera->mClipPlaneNear = fVar4;
        }
        else {
          pcVar3 = ODDLParser::Value::getString(local_28->m_value);
          iVar1 = ASSIMP_strincmp("far",pcVar3,3);
          if (iVar1 == 0) {
            this->m_currentCamera->mClipPlaneFar = fVar4;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleParamNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if ( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if ( nullptr == prop ) {
        return;
    }

    if ( nullptr != prop->m_value ) {
        Value *val( node->getValue() );
        if ( nullptr == val ) {
            return;
        }
        const float floatVal( val->getFloat() );
        if ( 0 == ASSIMP_strincmp( "fov", prop->m_value->getString(), 3 ) ) {
            m_currentCamera->mHorizontalFOV = floatVal;
        } else if ( 0 == ASSIMP_strincmp( "near", prop->m_value->getString(), 4 ) ) {
            m_currentCamera->mClipPlaneNear = floatVal;
        } else if ( 0 == ASSIMP_strincmp( "far", prop->m_value->getString(), 3 ) ) {
            m_currentCamera->mClipPlaneFar = floatVal;
        }
    }
}